

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O0

int absl::GetStackTraceWithContext
              (void **result,int max_depth,int skip_count,void *uc,int *min_dropped_frames)

{
  int iVar1;
  __pointer_type p_Var2;
  int *min_dropped_frames_local;
  void *uc_local;
  int skip_count_local;
  int max_depth_local;
  void **result_local;
  int size;
  Unwinder g;
  Unwinder f;
  
  g = UnwindImpl<false,true>;
  p_Var2 = std::atomic<int_(*)(void_**,_int_*,_int,_int,_const_void_*,_int_*)>::load
                     ((atomic<int_(*)(void_**,_int_*,_int,_int,_const_void_*,_int_*)> *)
                      &(anonymous_namespace)::custom,acquire);
  if (p_Var2 != (__pointer_type)0x0) {
    g = p_Var2;
  }
  iVar1 = (*g)(result,(int *)0x0,max_depth,skip_count + 1,uc,min_dropped_frames);
  return iVar1;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE ABSL_ATTRIBUTE_NO_TAIL_CALL int
GetStackTraceWithContext(void** result, int max_depth, int skip_count,
                         const void* uc, int* min_dropped_frames) {
  return Unwind<false, true>(result, nullptr, max_depth, skip_count, uc,
                             min_dropped_frames);
}